

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O3

void __thiscall
helics::MessageFederate::registerMessageInterfacesToml(MessageFederate *this,string *tomlString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool targeted;
  pointer pbVar2;
  MessageFederate *pMVar3;
  bool bVar4;
  enable_if_t<detail::is_exact_toml_type<bool,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<bool>_&>
  pbVar5;
  value_type *pvVar6;
  array_type *paVar7;
  Endpoint *pEVar8;
  HelicsException *pHVar9;
  value *extraout_RDX;
  value *element;
  value *extraout_RDX_00;
  value *extraout_RDX_01;
  value *extraout_RDX_02;
  value *pvVar10;
  value *extraout_RDX_03;
  value *extraout_RDX_04;
  value *extraout_RDX_05;
  basic_value<toml::type_config> *pbVar11;
  char *pcVar12;
  basic_value<toml::type_config> *ept;
  pointer pbVar13;
  string_view eptName_00;
  string_view name;
  string_view message;
  string_view message_00;
  string_view type_00;
  bool defaultGlobal;
  string type;
  string eptName;
  value doc;
  bool local_213;
  bool local_212;
  undefined1 local_211;
  key_type local_210;
  string local_1f0;
  MessageFederate *local_1d0;
  undefined1 local_1c8 [72];
  region local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  pointer local_100;
  basic_value<toml::type_config> local_f8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_f8);
  fileops::loadToml((value *)local_1c8,tomlString);
  pbVar11 = (basic_value<toml::type_config> *)local_1c8;
  local_1d0 = this;
  toml::basic_value<toml::type_config>::operator=(&local_f8,pbVar11);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_1c8,(EVP_PKEY_CTX *)pbVar11);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  toml::detail::region::~region(&local_180);
  local_213 = false;
  pcVar12 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"defaultglobal","");
  fileops::replaceIfMember<bool>(&local_f8,(string *)local_1c8,&local_213);
  if ((char *)local_1c8._0_8_ != pcVar12) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  local_1c8._0_8_ = pcVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"targeted","");
  local_1f0._M_dataplus._M_p = local_1f0._M_dataplus._M_p & 0xffffffffffffff00;
  pbVar5 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                     (&local_f8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
                      ,(bool *)&local_1f0);
  local_211 = *pbVar5;
  if ((char *)local_1c8._0_8_ != pcVar12) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  local_1c8._0_8_ = pcVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"endpoints","");
  bVar4 = fileops::isMember(&local_f8,(string *)local_1c8);
  if ((char *)local_1c8._0_8_ != pcVar12) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if (bVar4) {
    local_1c8._0_8_ = pcVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"endpoints","");
    pvVar6 = toml::basic_value<toml::type_config>::at(&local_f8,(key_type *)local_1c8);
    if ((char *)local_1c8._0_8_ != pcVar12) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (pvVar6->type_ != array) {
      pHVar9 = (HelicsException *)__cxa_allocate_exception(0x28);
      message._M_str = "endpoints section in toml file must be an array";
      message._M_len = 0x2f;
      HelicsException::HelicsException(pHVar9,message);
      *(undefined ***)pHVar9 = &PTR__HelicsException_00512398;
      __cxa_throw(pHVar9,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar7 = toml::basic_value<toml::type_config>::as_array(pvVar6);
    pbVar13 = (paVar7->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_100 = (paVar7->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != local_100) {
      paVar1 = &local_210.field_2;
      pvVar10 = extraout_RDX;
      do {
        fileops::getName_abi_cxx11_((string *)local_1c8,(fileops *)pbVar13,pvVar10);
        local_210._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"type","");
        bVar4 = toml::basic_value<toml::type_config>::contains(pbVar13,&local_210);
        if (bVar4) {
          pvVar6 = toml::basic_value<toml::type_config>::at(pbVar13,&local_210);
          fileops::tomlAsString_abi_cxx11_(&local_1f0,(fileops *)pvVar6,element);
        }
        else {
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          local_1f0._M_string_length = 0;
          local_1f0.field_2._M_local_buf[0] = '\0';
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        local_210._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"global","");
        local_212 = local_213;
        pbVar5 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                           (pbVar13,&local_210,&local_212);
        bVar4 = *pbVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        local_210._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"targeted","");
        local_212 = (bool)local_211;
        pbVar5 = toml::find_or<bool,toml::type_config,std::__cxx11::string>
                           (pbVar13,&local_210,&local_212);
        targeted = *pbVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        pMVar3 = local_1d0;
        eptName_00._M_str = (char *)local_1c8._0_8_;
        eptName_00._M_len = local_1c8._8_8_;
        type_00._M_str = local_1f0._M_dataplus._M_p;
        type_00._M_len = local_1f0._M_string_length;
        pEVar8 = registerEndpoint(local_1d0,eptName_00,type_00,bVar4,targeted);
        loadOptions<toml::basic_value<toml::type_config>>(pMVar3,pbVar13,pEVar8);
        pvVar10 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
          pvVar10 = extraout_RDX_01;
        }
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          pvVar10 = extraout_RDX_02;
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != local_100);
    }
  }
  pcVar12 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"datasinks","");
  pbVar11 = (basic_value<toml::type_config> *)local_1c8;
  bVar4 = fileops::isMember(&local_f8,(string *)pbVar11);
  if ((char *)local_1c8._0_8_ != pcVar12) {
    pbVar11 = (basic_value<toml::type_config> *)(local_1c8._16_8_ + 1);
    operator_delete((void *)local_1c8._0_8_,(ulong)pbVar11);
  }
  if (bVar4) {
    local_1c8._0_8_ = pcVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"datasinks","");
    pbVar11 = (basic_value<toml::type_config> *)local_1c8;
    pvVar6 = toml::basic_value<toml::type_config>::at(&local_f8,(key_type *)pbVar11);
    if ((char *)local_1c8._0_8_ != pcVar12) {
      pbVar11 = (basic_value<toml::type_config> *)(local_1c8._16_8_ + 1);
      operator_delete((void *)local_1c8._0_8_,(ulong)pbVar11);
    }
    if (pvVar6->type_ != array) {
      pHVar9 = (HelicsException *)__cxa_allocate_exception(0x28);
      message_00._M_str = "datasinks section in toml file must be an array";
      message_00._M_len = 0x2f;
      HelicsException::HelicsException(pHVar9,message_00);
      *(undefined ***)pHVar9 = &PTR__HelicsException_00512398;
      __cxa_throw(pHVar9,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar7 = toml::basic_value<toml::type_config>::as_array(pvVar6);
    pMVar3 = local_1d0;
    pbVar13 = (paVar7->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (paVar7->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != pbVar2) {
      pvVar10 = extraout_RDX_03;
      do {
        fileops::getName_abi_cxx11_((string *)local_1c8,(fileops *)pbVar13,pvVar10);
        name._M_str = (char *)local_1c8._0_8_;
        name._M_len = local_1c8._8_8_;
        pEVar8 = MessageFederateManager::registerDataSink
                           ((pMVar3->mfManager)._M_t.
                            super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                            .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>.
                            _M_head_impl,name);
        pbVar11 = pbVar13;
        loadOptions<toml::basic_value<toml::type_config>>(pMVar3,pbVar13,pEVar8);
        pvVar10 = extraout_RDX_04;
        if ((char *)local_1c8._0_8_ != pcVar12) {
          pbVar11 = (basic_value<toml::type_config> *)(local_1c8._16_8_ + 1);
          operator_delete((void *)local_1c8._0_8_,(ulong)pbVar11);
          pvVar10 = extraout_RDX_05;
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != pbVar2);
    }
  }
  toml::basic_value<toml::type_config>::cleanup(&local_f8,(EVP_PKEY_CTX *)pbVar11);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8.comments_);
  toml::detail::region::~region(&local_f8.region_);
  return;
}

Assistant:

void MessageFederate::registerMessageInterfacesToml(const std::string& tomlString)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    fileops::replaceIfMember(doc, "defaultglobal", defaultGlobal);
    const bool defaultTargeted = fileops::getOrDefault(doc, "targeted", false);
    if (fileops::isMember(doc, "endpoints")) {
        auto& epts = toml::find(doc, "endpoints");
        if (!epts.is_array()) {
            throw(helics::InvalidParameter("endpoints section in toml file must be an array"));
        }
        auto& eptArray = epts.as_array();
        for (auto& ept : eptArray) {
            auto eptName = fileops::getName(ept);
            auto type = fileops::getOrDefault(ept, "type", emptyStr);
            const bool global = fileops::getOrDefault(ept, "global", defaultGlobal);
            const bool targeted = fileops::getOrDefault(ept, "targeted", defaultTargeted);
            Endpoint& epObj = registerEndpoint(eptName, type, global, targeted);

            loadOptions(this, ept, epObj);
        }
    }
    if (fileops::isMember(doc, "datasinks")) {
        auto& epts = toml::find(doc, "datasinks");
        if (!epts.is_array()) {
            throw(helics::InvalidParameter("datasinks section in toml file must be an array"));
        }
        auto& eptArray = epts.as_array();
        for (auto& ept : eptArray) {
            auto key = fileops::getName(ept);
            Endpoint& epObj = registerDataSink(key);

            loadOptions(this, ept, epObj);
        }
    }
}